

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

int testJSONHelpers(int param_1,char **param_2)

{
  char *pcVar1;
  size_t sVar2;
  pointer pMVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  Object<(anonymous_namespace)::ObjectStruct> *this;
  Value *pVVar10;
  ValueHolder VVar11;
  long lVar12;
  pointer pMVar13;
  _Any_data *name;
  undefined1 in_R8B;
  uint uVar14;
  cmJSONState state;
  Object<(anonymous_namespace)::ObjectStruct> helper;
  int i;
  string str;
  ObjectStruct s5;
  ObjectStruct s1;
  Value v;
  ObjectStruct s6;
  ObjectStruct s7;
  ObjectStruct s2;
  ObjectStruct s3;
  ObjectStruct s4;
  undefined1 local_408 [24];
  bool abStack_3f0 [8];
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Any_data local_398;
  _Manager_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  undefined1 local_370 [16];
  undefined1 local_360 [24];
  _Alloc_hider local_348;
  size_type local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Any_data local_328;
  code *local_318;
  code *pcStack_310;
  _Any_data local_308;
  code *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  ValueHolder local_2d8;
  undefined8 local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  ValueHolder local_2b0;
  char *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  int local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  undefined8 local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  ValueHolder local_268;
  ValueHolder VStack_260;
  char *local_258;
  undefined1 local_250;
  _Any_data local_248;
  code *local_238;
  char local_228;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  local_220;
  ObjectStruct local_200;
  _Any_data local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Any_data local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  code *local_140;
  undefined8 local_138;
  code *local_130;
  undefined8 uStack_128;
  ValueHolder local_120;
  undefined8 local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Any_data local_d8;
  code *local_c8;
  _Any_data local_b8;
  code *local_a8;
  _Any_data local_98;
  code *local_88;
  InheritedStruct local_78;
  
  Json::Value::Value((Value *)&local_268,2);
  local_3e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  abStack_3f0[1] = false;
  abStack_3f0[2] = false;
  abStack_3f0[3] = false;
  abStack_3f0[4] = false;
  abStack_3f0[5] = false;
  abStack_3f0[6] = false;
  abStack_3f0[7] = false;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_3e8._M_invoker = (_Invoker_type)0x0;
  local_3c8._M_local_buf[0] = false;
  local_370._0_4_ = 0;
  uVar5 = local_370._0_4_;
  local_370._0_4_ = 0;
  local_3e8.super__Function_base._M_manager = (_Manager_type)&local_3c8;
  local_3b8._0_8_ = &local_268;
  if ((anonymous_namespace)::IntHelper._16_8_ == 0) goto LAB_001b2d29;
  local_328._M_unused._M_object = local_408;
  cVar6 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                    ((anonymous_namespace)::IntHelper,local_370,local_3b8,&local_328);
  if (cVar6 == '\0') {
    iVar8 = 0x55;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(IntHelper(i, &v, &state)) failed on line ",0x35);
LAB_001b0919:
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    bVar7 = false;
  }
  else {
    if (local_370._0_4_ != 2) {
      iVar8 = 0x56;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ",0x23);
      goto LAB_001b0919;
    }
    local_370._0_4_ = 0;
    Json::Value::Value((Value *)local_3b8,nullValue);
    Json::Value::operator=((Value *)&local_268,(Value *)local_3b8);
    Json::Value::~Value((Value *)local_3b8);
    local_3b8._0_8_ = &local_268;
    uVar5 = local_370._0_4_;
    if ((anonymous_namespace)::IntHelper._16_8_ == 0) {
LAB_001b2d29:
      local_370._0_4_ = uVar5;
      local_328._M_unused._M_object = local_408;
      std::__throw_bad_function_call();
    }
    local_328._M_unused._M_object = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                      ((anonymous_namespace)::IntHelper,local_370,local_3b8,&local_328);
    if (cVar6 != '\0') {
      iVar8 = 0x5a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!IntHelper(i, &v, &state)) failed on line ",0x36
                );
      goto LAB_001b0919;
    }
    local_370._0_4_ = 0;
    local_3b8._0_8_ = (ValueHolder *)0x0;
    uVar5 = local_370._0_4_;
    if ((anonymous_namespace)::IntHelper._16_8_ == 0) goto LAB_001b2d29;
    local_328._M_unused._M_object = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                      ((anonymous_namespace)::IntHelper,local_370,local_3b8,&local_328);
    if (cVar6 == '\0') {
      iVar8 = 0x5d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(IntHelper(i, nullptr, &state)) failed on line ",
                 0x3a);
      goto LAB_001b0919;
    }
    bVar7 = true;
    if (local_370._0_4_ != 1) {
      iVar8 = 0x5e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ",0x23);
      goto LAB_001b0919;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.super__Function_base._M_manager != &local_3c8) {
    operator_delete(local_3e8.super__Function_base._M_manager,
                    CONCAT71(local_3c8._M_allocated_capacity._1_7_,local_3c8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_3f0);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_408);
  Json::Value::~Value((Value *)&local_268);
  if (!bVar7) {
    return 1;
  }
  Json::Value::Value((Value *)&local_268,2);
  local_3e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  abStack_3f0[1] = false;
  abStack_3f0[2] = false;
  abStack_3f0[3] = false;
  abStack_3f0[4] = false;
  abStack_3f0[5] = false;
  abStack_3f0[6] = false;
  abStack_3f0[7] = false;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_3e8._M_invoker = (_Invoker_type)0x0;
  local_3c8._M_local_buf[0] = false;
  local_370._0_8_ = (ulong)(uint)local_370._4_4_ << 0x20;
  local_3e8.super__Function_base._M_manager = (_Manager_type)&local_3c8;
  local_3b8._0_8_ = &local_268;
  if ((anonymous_namespace)::UIntHelper._16_8_ == 0) goto LAB_001b2d2e;
  local_328._M_unused._M_object = local_408;
  cVar6 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                    ((anonymous_namespace)::UIntHelper,local_370,local_3b8,&local_328);
  if (cVar6 == '\0') {
    iVar8 = 0x68;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(UIntHelper(i, &v, &state)) failed on line ",0x36);
LAB_001b0b76:
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    bVar7 = false;
  }
  else {
    if (local_370._0_4_ != 2) {
      iVar8 = 0x69;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ",0x23);
      goto LAB_001b0b76;
    }
    local_370._0_8_ = local_370._0_8_ & 0xffffffff00000000;
    Json::Value::Value((Value *)local_3b8,nullValue);
    Json::Value::operator=((Value *)&local_268,(Value *)local_3b8);
    Json::Value::~Value((Value *)local_3b8);
    local_3b8._0_8_ = &local_268;
    if ((anonymous_namespace)::UIntHelper._16_8_ == 0) {
LAB_001b2d2e:
      local_328._M_unused._M_object = local_408;
      std::__throw_bad_function_call();
    }
    local_328._M_unused._M_object = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                      ((anonymous_namespace)::UIntHelper,local_370,local_3b8,&local_328);
    if (cVar6 != '\0') {
      iVar8 = 0x6c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!UIntHelper(i, &v, &state)) failed on line ",
                 0x37);
      goto LAB_001b0b76;
    }
    local_370._0_8_ = local_370._0_8_ & 0xffffffff00000000;
    local_3b8._0_8_ = (ValueHolder *)0x0;
    if ((anonymous_namespace)::UIntHelper._16_8_ == 0) goto LAB_001b2d2e;
    local_328._M_unused._M_object = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                      ((anonymous_namespace)::UIntHelper,local_370,local_3b8,&local_328);
    if (cVar6 == '\0') {
      iVar8 = 0x6f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(UIntHelper(i, nullptr, &state)) failed on line "
                 ,0x3b);
      goto LAB_001b0b76;
    }
    bVar7 = true;
    if (local_370._0_4_ != 1) {
      iVar8 = 0x70;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ",0x23);
      goto LAB_001b0b76;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.super__Function_base._M_manager != &local_3c8) {
    operator_delete(local_3e8.super__Function_base._M_manager,
                    CONCAT71(local_3c8._M_allocated_capacity._1_7_,local_3c8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_3f0);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_408);
  Json::Value::~Value((Value *)&local_268);
  if (!bVar7) {
    return 1;
  }
  Json::Value::Value((Value *)&local_268,true);
  local_3e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  abStack_3f0[1] = false;
  abStack_3f0[2] = false;
  abStack_3f0[3] = false;
  abStack_3f0[4] = false;
  abStack_3f0[5] = false;
  abStack_3f0[6] = false;
  abStack_3f0[7] = false;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_3e8._M_invoker = (_Invoker_type)0x0;
  local_3c8._M_local_buf[0] = false;
  local_370._0_8_ = local_370._0_8_ & 0xffffffffffffff00;
  local_3e8.super__Function_base._M_manager = (_Manager_type)&local_3c8;
  local_3b8._0_8_ = &local_268;
  if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_001b2d33;
  local_328._M_unused._M_object = local_408;
  cVar6 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                    ((anonymous_namespace)::BoolHelper,local_370,local_3b8,&local_328);
  if (cVar6 == '\0') {
    iVar8 = 0x7a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(BoolHelper(b, &v, &state)) failed on line ",0x36);
LAB_001b0e2d:
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    bVar7 = false;
  }
  else {
    if (local_370[0] == '\0') {
      iVar8 = 0x7b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(b) failed on line ",0x1e);
      goto LAB_001b0e2d;
    }
    local_370._0_8_ = local_370._0_8_ & 0xffffffffffffff00;
    Json::Value::Value((Value *)local_3b8,false);
    Json::Value::operator=((Value *)&local_268,(Value *)local_3b8);
    Json::Value::~Value((Value *)local_3b8);
    local_3b8._0_8_ = &local_268;
    if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_001b2d33;
    local_328._M_unused._M_object = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                      ((anonymous_namespace)::BoolHelper,local_370,local_3b8,&local_328);
    if (cVar6 == '\0') {
      iVar8 = 0x7f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(BoolHelper(b, &v, &state)) failed on line ",0x36
                );
      goto LAB_001b0e2d;
    }
    if (local_370[0] == '\x01') {
      iVar8 = 0x80;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ",0x1f);
      goto LAB_001b0e2d;
    }
    local_370._0_8_ = local_370._0_8_ & 0xffffffffffffff00;
    Json::Value::Value((Value *)local_3b8,4);
    Json::Value::operator=((Value *)&local_268,(Value *)local_3b8);
    Json::Value::~Value((Value *)local_3b8);
    local_3b8._0_8_ = &local_268;
    if ((anonymous_namespace)::BoolHelper._16_8_ == 0) {
LAB_001b2d33:
      local_328._M_unused._M_object = local_408;
      std::__throw_bad_function_call();
    }
    local_328._M_unused._M_object = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                      ((anonymous_namespace)::BoolHelper,local_370,local_3b8,&local_328);
    if (cVar6 != '\0') {
      iVar8 = 0x84;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!BoolHelper(b, &v, &state)) failed on line ",
                 0x37);
      goto LAB_001b0e2d;
    }
    local_370[0] = 1;
    local_3b8._0_8_ = (ValueHolder *)0x0;
    if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_001b2d33;
    local_328._M_unused._M_object = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                      ((anonymous_namespace)::BoolHelper,local_370,local_3b8,&local_328);
    if (cVar6 == '\0') {
      iVar8 = 0x87;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(BoolHelper(b, nullptr, &state)) failed on line "
                 ,0x3b);
      goto LAB_001b0e2d;
    }
    bVar7 = true;
    if (local_370[0] == '\x01') {
      iVar8 = 0x88;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ",0x1f);
      goto LAB_001b0e2d;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.super__Function_base._M_manager != &local_3c8) {
    operator_delete(local_3e8.super__Function_base._M_manager,
                    CONCAT71(local_3c8._M_allocated_capacity._1_7_,local_3c8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_3f0);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_408);
  Json::Value::~Value((Value *)&local_268);
  if (!bVar7) {
    return 1;
  }
  Json::Value::Value((Value *)&local_268,"str");
  local_3e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  abStack_3f0[1] = false;
  abStack_3f0[2] = false;
  abStack_3f0[3] = false;
  abStack_3f0[4] = false;
  abStack_3f0[5] = false;
  abStack_3f0[6] = false;
  abStack_3f0[7] = false;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_3e8._M_invoker = (_Invoker_type)0x0;
  local_3c8._M_local_buf[0] = false;
  local_328._8_8_ = (char *)0x0;
  local_318 = (code *)((ulong)local_318 & 0xffffffffffffff00);
  local_3e8.super__Function_base._M_manager = (_Manager_type)&local_3c8;
  local_3b8._0_8_ = &local_268;
  local_328._M_unused._M_object = &local_318;
  if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b2d38;
  local_370._0_8_ = local_408;
  cVar6 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::StringHelper_abi_cxx11_,&local_328,local_3b8,local_370);
  if (cVar6 == '\0') {
    iVar8 = 0x92;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(StringHelper(str, &v, &state)) failed on line ",
               0x3a);
LAB_001b0f75:
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    bVar7 = false;
  }
  else {
    iVar8 = std::__cxx11::string::compare(local_328._M_pod_data);
    if (iVar8 != 0) {
      iVar8 = 0x93;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str == \"str\") failed on line ",0x29);
      goto LAB_001b0f75;
    }
    in_R8B = 0;
    std::__cxx11::string::_M_replace((ulong)&local_328,0,(char *)local_328._8_8_,0x98e619);
    Json::Value::Value((Value *)local_3b8,nullValue);
    Json::Value::operator=((Value *)&local_268,(Value *)local_3b8);
    Json::Value::~Value((Value *)local_3b8);
    local_3b8._0_8_ = &local_268;
    if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0) {
LAB_001b2d38:
      local_370._0_8_ = local_408;
      std::__throw_bad_function_call();
    }
    local_370._0_8_ = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_._24_8_)
                      ((anonymous_namespace)::StringHelper_abi_cxx11_,&local_328,local_3b8,local_370
                      );
    if (cVar6 != '\0') {
      iVar8 = 0x97;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!StringHelper(str, &v, &state)) failed on line "
                 ,0x3b);
      goto LAB_001b0f75;
    }
    in_R8B = 0;
    std::__cxx11::string::_M_replace((ulong)&local_328,0,(char *)local_328._8_8_,0x98e619);
    local_3b8._0_8_ = (ValueHolder *)0x0;
    if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b2d38;
    local_370._0_8_ = local_408;
    cVar6 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_._24_8_)
                      ((anonymous_namespace)::StringHelper_abi_cxx11_,&local_328,local_3b8,local_370
                      );
    if (cVar6 == '\0') {
      iVar8 = 0x9a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(StringHelper(str, nullptr, &state)) failed on line ",0x3f);
      goto LAB_001b0f75;
    }
    iVar8 = std::__cxx11::string::compare(local_328._M_pod_data);
    if (iVar8 != 0) {
      iVar8 = 0x9b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str == \"default\") failed on line ",0x2d);
      goto LAB_001b0f75;
    }
    bVar7 = true;
  }
  if ((code **)local_328._M_unused._0_8_ != &local_318) {
    operator_delete(local_328._M_unused._M_object,(ulong)(local_318 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.super__Function_base._M_manager != &local_3c8) {
    operator_delete(local_3e8.super__Function_base._M_manager,
                    CONCAT71(local_3c8._M_allocated_capacity._1_7_,local_3c8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_3f0);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_408);
  Json::Value::~Value((Value *)&local_268);
  if (!bVar7) {
    return 1;
  }
  local_220.super__Function_base._M_functor._8_8_ = 0;
  local_220.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_OBJECT;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  local_3e8._M_invoker =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_invoke;
  local_3e8.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_OBJECT;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_3e8.super__Function_base._M_manager =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_manager;
  local_220.super__Function_base._M_manager = (_Manager_type)0x0;
  local_220._M_invoker = (_Invoker_type)0x0;
  local_3c8._M_local_buf[0] = true;
  local_3b8._0_8_ = (code *)0x8;
  local_3b8._8_8_ = "subfield";
  std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_98,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
             (anonymous_namespace)::IntHelper);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
  Bind<(anonymous_namespace)::ObjectStruct,int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_408,(string_view *)local_3b8,
             (offset_in_ObjectStruct_to_int)&local_98,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)0x1,(bool)in_R8B);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
            ((Object<(anonymous_namespace)::ObjectStruct> *)&local_268,
             (Object<(anonymous_namespace)::ObjectStruct> *)local_408);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_3e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3e8.super__Function_base._M_manager)(&local_3e8,&local_3e8,3);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)local_408);
  if (local_220.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_220.super__Function_base._M_manager)
              ((_Any_data *)&local_220,(_Any_data *)&local_220,__destroy_functor);
  }
  local_138 = 0;
  local_140 = JsonErrors::INVALID_OBJECT;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  local_3e8._M_invoker =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_invoke;
  local_3e8.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_OBJECT;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_3e8.super__Function_base._M_manager =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_manager;
  local_130 = (code *)0x0;
  uStack_128 = 0;
  local_3c8._M_local_buf[0] = true;
  local_2b0.int_ = 6;
  local_2a8 = "field1";
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_b8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
  Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_408,(string_view *)&local_2b0,
             (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )&local_b8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)0x1,(bool)in_R8B);
  local_188._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  local_188._8_8_ = "field2";
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
            ((Object<(anonymous_namespace)::ObjectStruct> *)&local_328,
             (Object<(anonymous_namespace)::ObjectStruct> *)&local_268);
  local_370._8_8_ = 0;
  this = (Object<(anonymous_namespace)::ObjectStruct> *)operator_new(0x48);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
            (this,(Object<(anonymous_namespace)::ObjectStruct> *)&local_328);
  local_360._8_8_ =
       std::
       _Function_handler<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*),_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>_>
       ::_M_invoke;
  local_360._0_8_ =
       std::
       _Function_handler<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*),_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>_>
       ::_M_manager;
  local_370._0_8_ = this;
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::BindPrivate
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_408,(string_view *)local_188,
             (MemberFunction *)local_370,true);
  if ((_Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       )local_360._0_8_ !=
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    (*(code *)local_360._0_8_)(local_370,local_370,3);
  }
  local_370._0_8_ = 6;
  local_370._8_8_ = "field3";
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_d8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
  Bind<std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_408,(string_view *)local_370,
             &local_d8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)0x1,(bool)in_R8B);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,
             (Object<(anonymous_namespace)::ObjectStruct> *)local_408);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_2f8 != (code *)0x0) {
    (*local_2f8)(&local_308,&local_308,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)&local_328);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_3e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3e8.super__Function_base._M_manager)(&local_3e8,&local_3e8,3);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)local_408);
  if (local_130 != (code *)0x0) {
    (*local_130)(&local_140,&local_140,3);
  }
  Json::Value::Value((Value *)local_370,objectValue);
  local_3e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  abStack_3f0[1] = false;
  abStack_3f0[2] = false;
  abStack_3f0[3] = false;
  abStack_3f0[4] = false;
  abStack_3f0[5] = false;
  abStack_3f0[6] = false;
  abStack_3f0[7] = false;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_3e8._M_invoker = (_Invoker_type)0x0;
  local_3c8._M_local_buf[0] = false;
  local_3e8.super__Function_base._M_manager = (_Manager_type)&local_3c8;
  Json::Value::Value((Value *)&local_2b0,"Hello");
  pVVar10 = Json::Value::operator[]((Value *)local_370,"field1");
  Json::Value::operator=(pVVar10,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  Json::Value::Value((Value *)&local_2b0,objectValue);
  pVVar10 = Json::Value::operator[]((Value *)local_370,"field2");
  Json::Value::operator=(pVVar10,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  Json::Value::Value((Value *)&local_2b0,2);
  pVVar10 = Json::Value::operator[]((Value *)local_370,"field2");
  pVVar10 = Json::Value::operator[](pVVar10,"subfield");
  Json::Value::operator=(pVVar10,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  Json::Value::Value((Value *)&local_2b0,"world!");
  pVVar10 = Json::Value::operator[]((Value *)local_370,"field3");
  Json::Value::operator=(pVVar10,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  Json::Value::Value((Value *)&local_2b0,"extra");
  pVVar10 = Json::Value::operator[]((Value *)local_370,"extra");
  Json::Value::operator=(pVVar10,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  local_2b0.string_ = (char *)&local_2a0;
  local_2a8 = (char *)0x0;
  local_2a0._M_local_buf[0] = '\0';
  bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                    ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,
                     (ObjectStruct *)&local_2b0,(Value *)local_370,(cmJSONState *)local_408);
  if (bVar7) {
    iVar8 = std::__cxx11::string::compare((char *)&local_2b0.int_);
    if (iVar8 != 0) {
      iVar8 = 0xb3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ",0x31);
      goto LAB_001b1581;
    }
    if (local_290 != 2) {
      iVar8 = 0xb4;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line ",0x2b);
      goto LAB_001b1581;
    }
    Json::Value::Value((Value *)local_188,"wrong");
    pVVar10 = Json::Value::operator[]((Value *)local_370,"field2");
    pVVar10 = Json::Value::operator[](pVVar10,"subfield");
    Json::Value::operator=(pVVar10,(Value *)local_188);
    Json::Value::~Value((Value *)local_188);
    local_188._0_8_ = &local_178;
    local_188._8_8_ = (char *)0x0;
    local_178._M_local_buf[0] = '\0';
    bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                      ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,
                       (ObjectStruct *)local_188,(Value *)local_370,(cmJSONState *)local_408);
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s2, &v, &state)) failed on line ",0x34);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xb8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      bVar7 = false;
    }
    else {
      pVVar10 = Json::Value::operator[]((Value *)local_370,"field2");
      Json::Value::removeMember(pVVar10,"subfield");
      local_120.string_ = (char *)&local_110;
      local_118 = 0;
      local_110._M_local_buf[0] = '\0';
      bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                        ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,
                         (ObjectStruct *)&local_120,(Value *)local_370,(cmJSONState *)local_408);
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s3, &v, &state)) failed on line ",0x34
                  );
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xbc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        bVar7 = false;
      }
      else {
        Json::Value::removeMember((Value *)local_370,"field2");
        local_78.super_ObjectStruct.Field1._M_dataplus._M_p =
             (pointer)&local_78.super_ObjectStruct.Field1.field_2;
        local_78.super_ObjectStruct.Field1._M_string_length = 0;
        local_78.super_ObjectStruct.Field1.field_2._M_local_buf[0] = '\0';
        bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                          ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,
                           &local_78.super_ObjectStruct,(Value *)local_370,(cmJSONState *)local_408)
        ;
        if (bVar7) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s4, &v, &state)) failed on line ",
                     0x34);
          poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xc0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          bVar7 = false;
        }
        else {
          Json::Value::Value((Value *)&local_2d8,objectValue);
          pVVar10 = Json::Value::operator[]((Value *)local_370,"field2");
          Json::Value::operator=(pVVar10,(Value *)&local_2d8);
          Json::Value::~Value((Value *)&local_2d8);
          Json::Value::Value((Value *)&local_2d8,2);
          pVVar10 = Json::Value::operator[]((Value *)local_370,"field2");
          pVVar10 = Json::Value::operator[](pVVar10,"subfield");
          Json::Value::operator=(pVVar10,(Value *)&local_2d8);
          Json::Value::~Value((Value *)&local_2d8);
          Json::Value::Value((Value *)&local_2d8,3);
          pVVar10 = Json::Value::operator[]((Value *)local_370,"field3");
          Json::Value::operator=(pVVar10,(Value *)&local_2d8);
          Json::Value::~Value((Value *)&local_2d8);
          local_2d8.string_ = (char *)&local_2c8;
          local_2d0 = 0;
          local_2c8._M_local_buf[0] = '\0';
          bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                            ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,
                             (ObjectStruct *)&local_2d8,(Value *)local_370,(cmJSONState *)local_408)
          ;
          if (bVar7) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s5, &v, &state)) failed on line ",
                       0x34);
            poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xc6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            bVar7 = false;
          }
          else {
            Json::Value::removeMember((Value *)local_370,"field3");
            local_200.Field1._M_dataplus._M_p = (pointer)&local_200.Field1.field_2;
            local_200.Field1._M_string_length = 0;
            local_200.Field1.field_2._M_allocated_capacity =
                 local_200.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
            bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                              ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,&local_200,
                               (Value *)local_370,(cmJSONState *)local_408);
            if (bVar7) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(!helper(s6, &v, &state)) failed on line ",0x34);
              poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xca);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              bVar7 = false;
            }
            else {
              Json::Value::Value((Value *)&local_1d8,"Hello");
              Json::Value::operator=((Value *)local_370,(Value *)&local_1d8);
              Json::Value::~Value((Value *)&local_1d8);
              local_1d8._M_unused._M_object = &local_1c8;
              local_1d8._8_8_ = 0;
              local_1c8._M_local_buf[0] = '\0';
              bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                                ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,
                                 (ObjectStruct *)&local_1d8,(Value *)local_370,
                                 (cmJSONState *)local_408);
              if (bVar7) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(!helper(s7, &v, &state)) failed on line ",0x34);
                poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xce);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                bVar7 = false;
              }
              else {
                local_1b0._M_unused._M_object = &local_1a0;
                local_1b0._8_8_ = 0;
                local_1a0._M_local_buf[0] = '\0';
                bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                                  ((Object<(anonymous_namespace)::ObjectStruct> *)local_3b8,
                                   (ObjectStruct *)&local_1b0,(Value *)0x0,(cmJSONState *)local_408)
                ;
                if (bVar7) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(!helper(s8, nullptr, &state)) failed on line ",0x39);
                  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xd1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_unused._0_8_ != &local_1a0) {
                  operator_delete(local_1b0._M_unused._M_object,
                                  CONCAT71(local_1a0._M_allocated_capacity._1_7_,
                                           local_1a0._M_local_buf[0]) + 1);
                }
                bVar7 = !bVar7;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_unused._0_8_ != &local_1c8) {
                operator_delete(local_1d8._M_unused._M_object,
                                CONCAT71(local_1c8._M_allocated_capacity._1_7_,
                                         local_1c8._M_local_buf[0]) + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200.Field1._M_dataplus._M_p != &local_200.Field1.field_2) {
              operator_delete(local_200.Field1._M_dataplus._M_p,
                              local_200.Field1.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_2d8 != &local_2c8) {
            operator_delete(local_2d8.string_,
                            CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]
                                    ) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.super_ObjectStruct.Field1._M_dataplus._M_p !=
            &local_78.super_ObjectStruct.Field1.field_2) {
          operator_delete(local_78.super_ObjectStruct.Field1._M_dataplus._M_p,
                          CONCAT71(local_78.super_ObjectStruct.Field1.field_2._M_allocated_capacity.
                                   _1_7_,local_78.super_ObjectStruct.Field1.field_2._M_local_buf[0])
                          + 1);
        }
      }
      if (local_120 != &local_110) {
        operator_delete(local_120.string_,
                        CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]) +
                        1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._0_8_ != &local_178) {
      operator_delete((void *)local_188._0_8_,
                      CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1)
      ;
    }
  }
  else {
    iVar8 = 0xb2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(helper(s1, &v, &state)) failed on line ",0x33);
LAB_001b1581:
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    bVar7 = false;
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0.string_,
                    CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.super__Function_base._M_manager != &local_3c8) {
    operator_delete(local_3e8.super__Function_base._M_manager,
                    CONCAT71(local_3c8._M_allocated_capacity._1_7_,local_3c8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_3f0);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_408);
  Json::Value::~Value((Value *)local_370);
  if (local_388 != (_Manager_type)0x0) {
    (*local_388)(&local_398,&local_398,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)local_3b8);
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)&local_268);
  if (!bVar7) {
    return 1;
  }
  local_200.Field1._M_string_length = 0;
  local_200.Field1._M_dataplus._M_p =
       (pointer)anon_unknown.dwarf_baa8f::ErrorMessages::InvalidObject;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  local_3e8._M_invoker =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_invoke;
  local_3e8.super__Function_base._M_functor._M_unused._M_object =
       anon_unknown.dwarf_baa8f::ErrorMessages::InvalidObject;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_3e8.super__Function_base._M_manager =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_manager;
  local_200.Field1.field_2._M_allocated_capacity = 0;
  local_200.Field1.field_2._8_8_ = 0;
  local_3c8._M_local_buf[0] = true;
  local_370._0_8_ = (undefined1 *)0x6;
  local_370._8_8_ = "field1";
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_1d8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)local_3b8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_1d8);
  local_398._M_unused._M_object = (void *)0x0;
  local_328._M_unused._M_object = (void *)0x0;
  local_328._8_8_ = 0;
  local_318 = (code *)0x0;
  pcStack_310 = (code *)0x0;
  local_328._M_unused._M_object = operator_new(0x28);
  uVar4 = local_3a8._M_allocated_capacity;
  *(LargestInt *)local_328._M_unused._0_8_ = 0;
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 8))->int_ = 0;
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 0x10))->int_ = 0;
  *(undefined8 *)((long)local_328._M_unused._0_8_ + 0x18) = local_3a8._8_8_;
  if ((code *)local_3a8._M_allocated_capacity != (code *)0x0) {
    *(undefined8 *)local_328._M_unused._0_8_ = local_3b8._0_8_;
    *(undefined8 *)((long)local_328._M_unused._0_8_ + 8) = local_3b8._8_8_;
    *(size_type *)((long)local_328._M_unused._0_8_ + 0x10) = local_3a8._M_allocated_capacity;
    local_3a8._M_allocated_capacity = 0;
    local_3a8._8_8_ = (code *)0x0;
  }
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 0x20))->int_ = 0;
  pcStack_310 = std::
                _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
                ::_M_invoke;
  local_318 = std::
              _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
              ::_M_manager;
  cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
            ((Object<(anonymous_namespace)::InheritedStruct> *)local_408,(string_view *)local_370,
             (MemberFunction *)&local_328,SUB81(uVar4,0));
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,3);
  }
  if ((code *)local_3a8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_3a8._M_allocated_capacity)(local_3b8,local_3b8,3);
  }
  local_2b0.int_ = 6;
  local_2a8 = "field2";
  std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_1b0,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
             (anonymous_namespace)::IntHelper);
  std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)local_3b8,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_1b0);
  local_398._M_unused._M_member_pointer = 0x20;
  local_328._M_unused._M_object = (void *)0x0;
  local_328._8_8_ = 0;
  local_318 = (code *)0x0;
  pcStack_310 = (code *)0x0;
  local_328._M_unused._M_object = operator_new(0x28);
  uVar4 = local_3a8._M_allocated_capacity;
  *(LargestInt *)local_328._M_unused._0_8_ = 0;
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 8))->int_ = 0;
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 0x10))->int_ = 0;
  *(undefined8 *)((long)local_328._M_unused._0_8_ + 0x18) = local_3a8._8_8_;
  if ((code *)local_3a8._M_allocated_capacity != (code *)0x0) {
    *(undefined8 *)local_328._M_unused._0_8_ = local_3b8._0_8_;
    *(undefined8 *)((long)local_328._M_unused._0_8_ + 8) = local_3b8._8_8_;
    *(size_type *)((long)local_328._M_unused._0_8_ + 0x10) = local_3a8._M_allocated_capacity;
    local_3a8._M_allocated_capacity = 0;
    local_3a8._8_8_ = (code *)0x0;
  }
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 0x20))->int_ = 0x20;
  pcStack_310 = std::
                _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
                ::_M_invoke;
  local_318 = std::
              _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
              ::_M_manager;
  cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
            ((Object<(anonymous_namespace)::InheritedStruct> *)local_408,(string_view *)&local_2b0,
             (MemberFunction *)&local_328,SUB81(uVar4,0));
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,3);
  }
  if ((code *)local_3a8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_3a8._M_allocated_capacity)(local_3b8,local_3b8,3);
  }
  local_188._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  local_188._8_8_ = "field3";
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function(&local_220,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)local_3b8,&local_220);
  local_398._M_unused._M_member_pointer = 0x28;
  local_328._M_unused._M_object = (void *)0x0;
  local_328._8_8_ = 0;
  local_318 = (code *)0x0;
  pcStack_310 = (code *)0x0;
  local_328._M_unused._M_object = operator_new(0x28);
  uVar4 = local_3a8._M_allocated_capacity;
  *(code **)local_328._M_unused._0_8_ = (code *)0x0;
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 8))->int_ = 0;
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 0x10))->int_ = 0;
  *(undefined8 *)((long)local_328._M_unused._0_8_ + 0x18) = local_3a8._8_8_;
  if ((code *)local_3a8._M_allocated_capacity != (code *)0x0) {
    *(undefined8 *)local_328._M_unused._0_8_ = local_3b8._0_8_;
    *(undefined8 *)((long)local_328._M_unused._0_8_ + 8) = local_3b8._8_8_;
    *(size_type *)((long)local_328._M_unused._0_8_ + 0x10) = local_3a8._M_allocated_capacity;
    local_3a8._M_allocated_capacity = 0;
    local_3a8._8_8_ = (code *)0x0;
  }
  ((ValueHolder *)((long)local_328._M_unused._0_8_ + 0x20))->int_ = 0x28;
  pcStack_310 = std::
                _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
                ::_M_invoke;
  local_318 = std::
              _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
              ::_M_manager;
  name = (_Any_data *)local_188;
  cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
            ((Object<(anonymous_namespace)::InheritedStruct> *)local_408,(string_view *)name,
             (MemberFunction *)&local_328,SUB81(uVar4,0));
  if (local_318 != (code *)0x0) {
    name = &local_328;
    (*local_318)(name,name,3);
  }
  if ((code *)local_3a8._M_allocated_capacity != (code *)0x0) {
    name = (_Any_data *)local_3b8;
    (*(code *)local_3a8._M_allocated_capacity)(name,name,3);
  }
  lVar12 = CONCAT71(local_408._9_7_,local_408[8]) - local_408._0_8_;
  local_268.int_ = 0;
  VStack_260 = (ValueHolder)0x0;
  local_258 = (char *)0x0;
  VVar11.map_ = (ObjectValues *)
                std::
                _Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                ::_M_allocate((_Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                               *)((lVar12 >> 3) * 0x6db6db6db6db6db7),(size_t)name);
  local_258 = VVar11.string_ + lVar12;
  pMVar3 = (pointer)CONCAT71(local_408._9_7_,local_408[8]);
  local_268.map_ = VVar11.map_;
  VStack_260.map_ = VVar11.map_;
  for (pMVar13 = (pointer)local_408._0_8_; pMVar13 != pMVar3; pMVar13 = pMVar13 + 1) {
    pcVar1 = (char *)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pMVar13->Name)->_M_string_length;
    *(pointer *)VVar11.string_ =
         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pMVar13->Name)->
         _M_dataplus)._M_p;
    *(char **)&((VVar11.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = pcVar1;
    ((VVar11.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((VVar11.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    ((VVar11.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    ((VVar11.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pMVar13->Function)[1]._M_allocated_capacity != (code *)0x0) {
      (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pMVar13->Function)[1]._M_allocated_capacity)
                (&((VVar11.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pMVar13->Function,2);
      sVar2 = *(size_t *)((long)&pMVar13->Function + 0x18);
      ((VVar11.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&pMVar13->Function)[1]._M_allocated_capacity;
      ((VVar11.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = sVar2;
    }
    *(bool *)(VVar11.int_ + 0x30) = pMVar13->Required;
    VVar11.string_ = (char *)(VVar11.int_ + 0x38);
  }
  VStack_260 = VVar11;
  local_250 = abStack_3f0[0];
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_248,&local_3e8);
  local_228 = local_3c8._M_local_buf[0];
  if (local_220.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_220.super__Function_base._M_manager)
              ((_Any_data *)&local_220,(_Any_data *)&local_220,__destroy_functor);
  }
  if ((code *)CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0]) !=
      (code *)0x0) {
    (*(code *)CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0]))
              (&local_1b0,&local_1b0,3);
  }
  if ((code *)CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) !=
      (code *)0x0) {
    (*(code *)CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]))
              (&local_1d8,&local_1d8,3);
  }
  if (local_3e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3e8.super__Function_base._M_manager)(&local_3e8,&local_3e8,3);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
             *)local_408);
  if ((code *)local_200.Field1.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_200.Field1.field_2._M_allocated_capacity)(&local_200,&local_200,3);
  }
  Json::Value::Value((Value *)&local_2d8,objectValue);
  local_3e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_408[0x10] = 0;
  local_408._17_7_ = 0;
  abStack_3f0[0] = false;
  abStack_3f0[1] = false;
  abStack_3f0[2] = false;
  abStack_3f0[3] = false;
  abStack_3f0[4] = false;
  abStack_3f0[5] = false;
  abStack_3f0[6] = false;
  abStack_3f0[7] = false;
  local_408._0_8_ = (pointer)0x0;
  local_408[8] = 0;
  local_408._9_7_ = 0;
  local_3e8._M_invoker = (_Invoker_type)0x0;
  local_3c8._M_local_buf[0] = false;
  local_3e8.super__Function_base._M_manager = (_Manager_type)&local_3c8;
  Json::Value::Value((Value *)local_3b8,"Hello");
  pVVar10 = Json::Value::operator[]((Value *)&local_2d8,"field1");
  Json::Value::operator=(pVVar10,(Value *)local_3b8);
  Json::Value::~Value((Value *)local_3b8);
  Json::Value::Value((Value *)local_3b8,2);
  pVVar10 = Json::Value::operator[]((Value *)&local_2d8,"field2");
  Json::Value::operator=(pVVar10,(Value *)local_3b8);
  Json::Value::~Value((Value *)local_3b8);
  Json::Value::Value((Value *)local_3b8,"world!");
  pVVar10 = Json::Value::operator[]((Value *)&local_2d8,"field3");
  Json::Value::operator=(pVVar10,(Value *)local_3b8);
  Json::Value::~Value((Value *)local_3b8);
  Json::Value::Value((Value *)local_3b8,"extra");
  pVVar10 = Json::Value::operator[]((Value *)&local_2d8,"extra");
  Json::Value::operator=(pVVar10,(Value *)local_3b8);
  Json::Value::~Value((Value *)local_3b8);
  local_3b8._0_8_ = &local_3a8;
  local_3b8._8_8_ = (pointer)0x0;
  local_3a8._M_allocated_capacity = local_3a8._M_allocated_capacity & 0xffffffffffffff00;
  local_388 = (_Manager_type)0x0;
  local_380._M_local_buf[0] = '\0';
  local_398._8_8_ = &local_380;
  bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                    ((Object<(anonymous_namespace)::InheritedStruct> *)&local_268,
                     (InheritedStruct *)local_3b8,(Value *)&local_2d8,(cmJSONState *)local_408);
  if (bVar7) {
    iVar8 = std::__cxx11::string::compare(local_3b8);
    if (iVar8 == 0) {
      if (local_398._0_4_ == 2) {
        iVar8 = std::__cxx11::string::compare(local_398._M_pod_data + 8);
        if (iVar8 == 0) {
          Json::Value::Value((Value *)&local_328,"wrong");
          pVVar10 = Json::Value::operator[]((Value *)&local_2d8,"field2");
          Json::Value::operator=(pVVar10,(Value *)&local_328);
          Json::Value::~Value((Value *)&local_328);
          local_328._8_8_ = 0;
          local_318 = (code *)((ulong)local_318 & 0xffffffffffffff00);
          local_308._8_8_ = &local_2f0;
          local_2f8 = (code *)0x0;
          local_2f0._M_local_buf[0] = '\0';
          local_328._M_unused._M_object = &local_318;
          bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                            ((Object<(anonymous_namespace)::InheritedStruct> *)&local_268,
                             (InheritedStruct *)&local_328,(Value *)&local_2d8,
                             (cmJSONState *)local_408);
          if (bVar7) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s2, &v, &state)) failed on line ",
                       0x34);
            poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xee);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            bVar7 = false;
          }
          else {
            Json::Value::removeMember((Value *)&local_2d8,"field2");
            local_370._0_8_ = local_360;
            local_370._8_8_ = (char *)0x0;
            local_360._0_8_ = local_360._0_8_ & 0xffffffffffffff00;
            local_348._M_p = (pointer)&local_338;
            local_340 = 0;
            local_338._M_local_buf[0] = '\0';
            bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                              ((Object<(anonymous_namespace)::InheritedStruct> *)&local_268,
                               (InheritedStruct *)local_370,(Value *)&local_2d8,
                               (cmJSONState *)local_408);
            if (bVar7) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(!helper(s3, &v, &state)) failed on line ",0x34);
              poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xf2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              bVar7 = false;
            }
            else {
              Json::Value::Value((Value *)&local_2b0,2);
              pVVar10 = Json::Value::operator[]((Value *)&local_2d8,"field2");
              Json::Value::operator=(pVVar10,(Value *)&local_2b0);
              Json::Value::~Value((Value *)&local_2b0);
              Json::Value::Value((Value *)&local_2b0,3);
              pVVar10 = Json::Value::operator[]((Value *)&local_2d8,"field3");
              Json::Value::operator=(pVVar10,(Value *)&local_2b0);
              Json::Value::~Value((Value *)&local_2b0);
              local_2b0.string_ = (char *)&local_2a0;
              local_2a8 = (char *)0x0;
              local_2a0._M_local_buf[0] = '\0';
              local_288 = &local_278;
              local_280 = 0;
              local_278._M_local_buf[0] = '\0';
              bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                      operator()((Object<(anonymous_namespace)::InheritedStruct> *)&local_268,
                                 (InheritedStruct *)&local_2b0,(Value *)&local_2d8,
                                 (cmJSONState *)local_408);
              if (bVar7) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(!helper(s4, &v, &state)) failed on line ",0x34);
                poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xf7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                bVar7 = false;
              }
              else {
                Json::Value::removeMember((Value *)&local_2d8,"field3");
                local_188._0_8_ = &local_178;
                local_188._8_8_ = (char *)0x0;
                local_178._M_local_buf[0] = '\0';
                local_160._M_p = (pointer)&local_150;
                local_158 = 0;
                local_150._M_local_buf[0] = '\0';
                bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                        operator()((Object<(anonymous_namespace)::InheritedStruct> *)&local_268,
                                   (InheritedStruct *)local_188,(Value *)&local_2d8,
                                   (cmJSONState *)local_408);
                if (bVar7) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(!helper(s5, &v, &state)) failed on line ",0x34);
                  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xfb);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  bVar7 = false;
                }
                else {
                  Json::Value::Value((Value *)&local_120,"Hello");
                  Json::Value::operator=((Value *)&local_2d8,(Value *)&local_120);
                  Json::Value::~Value((Value *)&local_120);
                  local_120.string_ = (char *)&local_110;
                  local_118 = 0;
                  local_110._M_local_buf[0] = '\0';
                  local_f8 = &local_e8;
                  local_f0 = 0;
                  local_e8._M_local_buf[0] = '\0';
                  bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                          operator()((Object<(anonymous_namespace)::InheritedStruct> *)&local_268,
                                     (InheritedStruct *)&local_120,(Value *)&local_2d8,
                                     (cmJSONState *)local_408);
                  if (bVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "ASSERT_TRUE(!helper(s6, &v, &state)) failed on line ",0x34);
                    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0xff);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                    bVar7 = false;
                  }
                  else {
                    local_78.super_ObjectStruct.Field1._M_dataplus._M_p =
                         (pointer)&local_78.super_ObjectStruct.Field1.field_2;
                    local_78.super_ObjectStruct.Field1._M_string_length = 0;
                    local_78.super_ObjectStruct.Field1.field_2._M_local_buf[0] = '\0';
                    local_78.Field3._M_dataplus._M_p = (pointer)&local_78.Field3.field_2;
                    local_78.Field3._M_string_length = 0;
                    local_78.Field3.field_2._M_local_buf[0] = '\0';
                    bVar7 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                            operator()((Object<(anonymous_namespace)::InheritedStruct> *)&local_268,
                                       &local_78,(Value *)0x0,(cmJSONState *)local_408);
                    if (bVar7) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "ASSERT_TRUE(!helper(s7, nullptr, &state)) failed on line ",0x39);
                      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0x102);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                    }
                    bVar7 = !bVar7;
                    anon_unknown.dwarf_baa8f::InheritedStruct::~InheritedStruct(&local_78);
                  }
                  anon_unknown.dwarf_baa8f::InheritedStruct::~InheritedStruct
                            ((InheritedStruct *)&local_120);
                }
                anon_unknown.dwarf_baa8f::InheritedStruct::~InheritedStruct
                          ((InheritedStruct *)local_188);
              }
              anon_unknown.dwarf_baa8f::InheritedStruct::~InheritedStruct
                        ((InheritedStruct *)&local_2b0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_p != &local_338) {
              operator_delete(local_348._M_p,
                              CONCAT71(local_338._M_allocated_capacity._1_7_,
                                       local_338._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_370._0_8_ != local_360) {
              operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._8_8_ != &local_2f0) {
            operator_delete((void *)local_308._8_8_,
                            CONCAT71(local_2f0._M_allocated_capacity._1_7_,local_2f0._M_local_buf[0]
                                    ) + 1);
          }
          if ((code **)local_328._M_unused._0_8_ != &local_318) {
            operator_delete(local_328._M_unused._M_object,(ulong)(local_318 + 1));
          }
          goto LAB_001b2025;
        }
        iVar8 = 0xea;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field3 == \"world!\") failed on line ",0x32
                  );
      }
      else {
        iVar8 = 0xe9;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line ",0x2b);
      }
    }
    else {
      iVar8 = 0xe8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ",0x31);
    }
  }
  else {
    iVar8 = 0xe7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(helper(s1, &v, &state)) failed on line ",0x33);
  }
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  bVar7 = false;
LAB_001b2025:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._8_8_ != &local_380) {
    operator_delete((void *)local_398._8_8_,
                    CONCAT71(local_380._M_allocated_capacity._1_7_,local_380._M_local_buf[0]) + 1);
  }
  uVar14 = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_,(ulong)(local_3a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.super__Function_base._M_manager != &local_3c8) {
    operator_delete(local_3e8.super__Function_base._M_manager,
                    CONCAT71(local_3c8._M_allocated_capacity._1_7_,local_3c8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_3f0);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_408);
  Json::Value::~Value((Value *)&local_2d8);
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
             *)&local_268);
  if (((((bVar7) && (bVar7 = anon_unknown.dwarf_baa8f::testObjectNoExtra(), bVar7)) &&
       (bVar7 = anon_unknown.dwarf_baa8f::testObjectOptional(), bVar7)) &&
      ((bVar7 = anon_unknown.dwarf_baa8f::testVector(), bVar7 &&
       (bVar7 = anon_unknown.dwarf_baa8f::testVectorFilter(), bVar7)))) &&
     ((bVar7 = anon_unknown.dwarf_baa8f::testMap(), bVar7 &&
      ((bVar7 = anon_unknown.dwarf_baa8f::testMapFilter(), bVar7 &&
       (bVar7 = anon_unknown.dwarf_baa8f::testOptional(), bVar7)))))) {
    bVar7 = anon_unknown.dwarf_baa8f::testRequired();
    uVar14 = (uint)!bVar7;
  }
  return uVar14;
}

Assistant:

int testJSONHelpers(int /*unused*/, char* /*unused*/[])
{
  if (!testInt()) {
    return 1;
  }
  if (!testUInt()) {
    return 1;
  }
  if (!testBool()) {
    return 1;
  }
  if (!testString()) {
    return 1;
  }
  if (!testObject()) {
    return 1;
  }
  if (!testObjectInherited()) {
    return 1;
  }
  if (!testObjectNoExtra()) {
    return 1;
  }
  if (!testObjectOptional()) {
    return 1;
  }
  if (!testVector()) {
    return 1;
  }
  if (!testVectorFilter()) {
    return 1;
  }
  if (!testMap()) {
    return 1;
  }
  if (!testMapFilter()) {
    return 1;
  }
  if (!testOptional()) {
    return 1;
  }
  if (!testRequired()) {
    return 1;
  }
  return 0;
}